

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O3

void msd_A2_register_hook(void)

{
  routine_register(&msd_A2_routine);
  return;
}

Assistant:

void
msd_A2_adaptive(unsigned char** strings, size_t N)
{
	cacheblock_t* cache =
		static_cast<cacheblock_t*>(malloc(N*sizeof(cacheblock_t)));
	for (size_t i=0; i < N; ++i) cache[i].ptr = strings[i];
	TempSpace tmp(strings, N);
	fill_cache(cache, N, 0);
	msd_A2_adaptive(cache, N, 0, 0, tmp);
	for (size_t i=0; i < N; ++i) strings[i] = cache[i].ptr;
	free(cache);
}